

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryStats.cpp
# Opt level: O1

DictionaryStats * __thiscall DictionaryStats::Clone(DictionaryStats *this)

{
  DictionaryStats *this_00;
  
  this_00 = (DictionaryStats *)
            Memory::NoCheckHeapAllocator::Alloc
                      ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,0x38);
  DictionaryStats(this_00,this->pName,this->initialSize);
  this_00->finalSize = this->finalSize;
  this_00->countOfEmptyBuckets = this->countOfEmptyBuckets;
  this_00->countOfResize = this->countOfResize;
  this_00->itemCount = this->itemCount;
  this_00->maxDepth = this->maxDepth;
  this_00->lookupCount = this->lookupCount;
  this_00->collisionCount = this->collisionCount;
  this_00->lookupDepthTotal = this->lookupDepthTotal;
  this_00->maxLookupDepth = this->maxLookupDepth;
  this_00->pName = this->pName;
  return this_00;
}

Assistant:

DictionaryStats* DictionaryStats::Clone()
{
    DictionaryStats* cloned = NoCheckHeapNew(DictionaryStats, pName, initialSize);
    cloned->finalSize = finalSize;
    cloned->countOfEmptyBuckets = countOfEmptyBuckets;
    cloned->countOfResize = countOfResize;
    cloned->itemCount = itemCount;
    cloned->maxDepth = maxDepth;
    cloned->lookupCount = lookupCount;
    cloned->collisionCount = collisionCount;
    cloned->lookupDepthTotal = lookupDepthTotal;
    cloned->maxLookupDepth = maxLookupDepth;
    cloned->pName = pName;
    return cloned;
}